

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  size_t width_02;
  TimeInMillis ms_00;
  size_t width_03;
  size_t width_04;
  size_t width_05;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  Indent_abi_cxx11_(&local_98,(internal *)0x8,in_RDX);
  poVar1 = std::operator<<(stream,(string *)&local_98);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"name",&local_9b);
  std::__cxx11::string::string((string *)&local_38,"",&local_99);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"status",&local_9b);
  std::__cxx11::string::string((string *)&local_38,"RUN",&local_99);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width_00);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"result",&local_9b);
  std::__cxx11::string::string((string *)&local_38,"COMPLETED",&local_99);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width_01);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"timestamp",&local_9b);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_38,(internal *)result->start_timestamp_,ms);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width_02);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"time",&local_9b);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_38,(internal *)result->elapsed_time_,ms_00);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width_03);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"testcase",&local_9a);
  std::__cxx11::string::string((string *)&local_78,"classname",&local_9b);
  std::__cxx11::string::string((string *)&local_38,"",&local_99);
  Indent_abi_cxx11_(&local_58,(internal *)0xa,width_04);
  OutputJsonKey(stream,&local_98,&local_78,&local_38,&local_58,false);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  Indent_abi_cxx11_(&local_78,(internal *)0xa,width_05);
  TestPropertiesAsJson(&local_98,result,&local_78);
  std::operator<<(stream,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  OutputJsonTestResult(stream,result);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);
}